

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_deviate_delete_unique
              (lys_module *module,lys_deviate *deviate,lys_node_list *list,int index,char *value)

{
  lys_ext_instance ***ext;
  byte bVar1;
  int iVar2;
  lys_unique *plVar3;
  byte bVar4;
  uint uVar5;
  lys_unique *plVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((ulong)list->unique_size != 0) {
    plVar6 = deviate->unique + index;
    bVar4 = deviate->unique[index].expr_size;
    uVar8 = 0;
    do {
      if (list->unique[uVar8].expr_size == bVar4) {
        bVar1 = plVar6->expr_size;
        uVar5 = (uint)bVar1;
        if (bVar1 == 0) {
          uVar5 = 0;
        }
        else {
          uVar7 = 0;
          do {
            if (list->unique[uVar8].expr[uVar7] != plVar6->expr[uVar7]) {
              uVar5 = (uint)uVar7;
              break;
            }
            uVar7 = uVar7 + 1;
          } while (bVar1 != uVar7);
        }
        if (uVar5 == bVar4) {
          plVar6 = (lys_unique *)&list->unique;
          plVar3 = list->unique + uVar8;
          if (list->unique[uVar8].expr_size != '\0') {
            uVar7 = 0;
            do {
              lydict_remove(module->ctx,plVar3->expr[uVar7]);
              uVar7 = uVar7 + 1;
              plVar3 = *(lys_unique **)plVar6 + uVar8;
            } while (uVar7 < (*(lys_unique **)plVar6)[uVar8].expr_size);
          }
          free(plVar3->expr);
          bVar4 = list->unique_size - 1;
          list->unique_size = bVar4;
          if (uVar8 != bVar4) {
            plVar3 = *(lys_unique **)plVar6;
            plVar3[uVar8].expr_size = plVar3[bVar4].expr_size;
            plVar3[uVar8].expr = plVar3[bVar4].expr;
          }
          plVar3 = *(lys_unique **)plVar6;
          if (bVar4 == 0) {
            free(plVar3);
          }
          else {
            plVar6 = plVar3 + bVar4;
            plVar3[bVar4].expr_size = '\0';
          }
          plVar6->expr = (char **)0x0;
          iVar2 = lys_ext_iter(list->ext,list->ext_size,'\0',LYEXT_SUBSTMT_UNIQUE);
          if (iVar2 == -1) {
            return 0;
          }
          ext = &list->ext;
          do {
            bVar4 = (*ext)[iVar2]->insubstmt_index;
            if ((uint)uVar8 == (uint)bVar4) {
              lyp_ext_instance_rm(module->ctx,ext,&list->ext_size,(uint8_t)iVar2);
              iVar2 = iVar2 + -1;
            }
            else if ((uint)uVar8 < (uint)bVar4) {
              (*ext)[iVar2]->insubstmt_index = bVar4 - 1;
            }
            iVar2 = lys_ext_iter(*ext,list->ext_size,(char)iVar2 + '\x01',LYEXT_SUBSTMT_UNIQUE);
          } while (iVar2 != -1);
          return 0;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != list->unique_size);
  }
  ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"unique");
  ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Value differs from the target being deleted.");
  return 1;
}

Assistant:

int
yang_deviate_delete_unique(struct lys_module *module, struct lys_deviate *deviate,
                           struct lys_node_list *list, int index, char * value)
{
    int i, j, k;

    /* find unique structures to delete */
    for (i = 0; i < list->unique_size; i++) {
        if (list->unique[i].expr_size != deviate->unique[index].expr_size) {
            continue;
        }

        for (j = 0; j < deviate->unique[index].expr_size; j++) {
            if (!ly_strequal(list->unique[i].expr[j], deviate->unique[index].expr[j], 1)) {
                break;
            }
        }

        if (j == deviate->unique[index].expr_size) {
            /* we have a match, free the unique structure ... */
            for (j = 0; j < list->unique[i].expr_size; j++) {
                lydict_remove(module->ctx, list->unique[i].expr[j]);
            }
            free(list->unique[i].expr);
            /* ... and maintain the array */
            list->unique_size--;
            if (i != list->unique_size) {
                list->unique[i].expr_size = list->unique[list->unique_size].expr_size;
                list->unique[i].expr = list->unique[list->unique_size].expr;
            }

            if (!list->unique_size) {
                free(list->unique);
                list->unique = NULL;
            } else {
                list->unique[list->unique_size].expr_size = 0;
                list->unique[list->unique_size].expr = NULL;
            }

            k = i; /* remember index for removing extensions */
            i = -1; /* set match flag */
            break;
        }
    }

    if (i != -1) {
        /* no match found */
        LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, value, "unique");
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Value differs from the target being deleted.");
        return EXIT_FAILURE;
    }

    /* remove extensions of this unique instance from the target node */
    j = -1;
    while ((j = lys_ext_iter(list->ext, list->ext_size, j + 1, LYEXT_SUBSTMT_UNIQUE)) != -1) {
        if (list->ext[j]->insubstmt_index == k) {
            lyp_ext_instance_rm(module->ctx, &list->ext, &list->ext_size, j);
            --j;
        } else if (list->ext[j]->insubstmt_index > k) {
            /* decrease the substatement index of the extension because of the changed array of uniques */
            list->ext[j]->insubstmt_index--;
        }
    }
    return EXIT_SUCCESS;
}